

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

SceneSignal __thiscall GroundScene::process(GroundScene *this,int state)

{
  SceneSignal SVar1;
  int state_local;
  GroundScene *this_local;
  SceneSignal signal;
  
  SceneSignal::SceneSignal((SceneSignal *)&this_local,10,0);
  if (state == 0) {
    this_local._0_4_ = 0xb;
    this_local._4_4_ = Suns::clearSun(this->suns[this->selectY][this->selectX]);
  }
  else if (state == 1) {
    this_local._0_4_ = 0xc;
    this_local._4_4_ = (uint)(this->plants[this->selectY][this->selectX] == (Plant *)0x0);
  }
  SVar1.data = this_local._4_4_;
  SVar1.type = (int)this_local;
  return SVar1;
}

Assistant:

SceneSignal GroundScene::process(int state){
	SceneSignal signal(GS_SIGNAL_NULL, 0);
	if(state == STATE_NORMAL){
		signal.type = GS_SIGNAL_ADD_SUN;
		signal.data = suns[selectY][selectX]->clearSun();
	}
	else if(state == STATE_PLANT){
		signal.type = GS_SIGNAL_PLANT_VALID;
		if(plants[selectY][selectX] == NULL){
			signal.data = 1;
		}	
		else{
			signal.data = 0;
		}
	}
	return signal;
}